

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

cio_websocket_write_job * dequeue_job(cio_websocket *websocket)

{
  cio_websocket_write_job *pcVar1;
  cio_websocket_write_job *pcVar2;
  
  pcVar1 = (websocket->ws_private).first_write_job;
  if (pcVar1 != (cio_websocket_write_job *)0x0) {
    if (pcVar1 == (websocket->ws_private).last_write_job) {
      pcVar2 = (cio_websocket_write_job *)0x0;
    }
    else {
      pcVar2 = pcVar1->next;
    }
    (websocket->ws_private).first_write_job = pcVar2;
  }
  return pcVar1;
}

Assistant:

static struct cio_websocket_write_job *dequeue_job(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = websocket->ws_private.first_write_job;
	if (job == NULL) {
		return NULL;
	}

	if (websocket->ws_private.first_write_job == websocket->ws_private.last_write_job) {
		websocket->ws_private.first_write_job = NULL;
	} else {
		websocket->ws_private.first_write_job = job->next;
	}

	return job;
}